

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalnull.c
# Opt level: O0

int ffpscl(fitsfile *fptr,double scale,double zero,int *status)

{
  long lVar1;
  int iVar2;
  fitsfile *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  int hdutype;
  tcolumn *colptr;
  uint in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int *in_stack_ffffffffffffffd0;
  int local_4;
  
  if (in_RSI->HDUposition < 1) {
    if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
      iVar2 = ffghdt(in_RSI,in_stack_ffffffffffffffd0,
                     (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      if (iVar2 < 1) {
        if (in_stack_ffffffffffffffcc == 0) {
          iVar2 = fits_is_compressed_image
                            ((fitsfile *)(ulong)in_stack_ffffffffffffffc8,(int *)0x2554c4);
          if (iVar2 == 0) {
            lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x3d0);
            *(double *)(lVar1 + 0x100) = in_XMM0_Qa;
            *(ulong *)(lVar1 + 0x108) = CONCAT44(in_XMM1_Db,in_XMM1_Da);
            local_4 = in_RSI->HDUposition;
          }
          else {
            *(double *)(*(long *)(in_RDI + 8) + 0x500) = in_XMM0_Qa;
            *(ulong *)(*(long *)(in_RDI + 8) + 0x508) = CONCAT44(in_XMM1_Db,in_XMM1_Da);
            local_4 = in_RSI->HDUposition;
          }
        }
        else {
          in_RSI->HDUposition = 0xe9;
          local_4 = 0xe9;
        }
      }
      else {
        local_4 = in_RSI->HDUposition;
      }
    }
    else {
      in_RSI->HDUposition = 0x142;
      local_4 = 0x142;
    }
  }
  else {
    local_4 = in_RSI->HDUposition;
  }
  return local_4;
}

Assistant:

int ffpscl(fitsfile *fptr,      /* I - FITS file pointer               */
           double scale,        /* I - scaling factor: value of BSCALE */
           double zero,         /* I - zero point: value of BZERO      */
           int *status)         /* IO - error status                   */
/*
  Define the linear scaling factor for the primary array or image extension
  pixel values. This routine overrides the scaling values given by the
  BSCALE and BZERO keywords if present.  Note that this routine does not
  write or modify the BSCALE and BZERO keywords, but instead only modifies
  the values temporarily in the internal buffer.  Thus, a subsequent call to
  the ffrdef routine will reset the scaling back to the BSCALE and BZERO
  keyword values (or 1. and 0. respectively if the keywords are not present).
*/
{
    tcolumn *colptr;
    int hdutype;

    if (*status > 0)
        return(*status);

    if (scale == 0)
        return(*status = ZERO_SCALE);  /* zero scale value is illegal */

    if (ffghdt(fptr, &hdutype, status) > 0)  /* get HDU type */
        return(*status);

    if (hdutype != IMAGE_HDU)
        return(*status = NOT_IMAGE);         /* not proper HDU type */

    if (fits_is_compressed_image(fptr, status)) /* compressed images */
    {
        (fptr->Fptr)->cn_bscale = scale;
        (fptr->Fptr)->cn_bzero  = zero;
        return(*status);
    }

    /* set pointer to the first 'column' (contains group parameters if any) */
    colptr = (fptr->Fptr)->tableptr; 

    colptr++;   /* increment to the 2nd 'column' pointer  (the image itself) */

    colptr->tscale = scale;
    colptr->tzero = zero;

    return(*status);
}